

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O1

void __thiscall
diy::Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<long>_>_>::~Registrar
          (Registrar<diy::RegularLink<diy::Bounds<long>_>_> *this)

{
  pointer pBVar1;
  
  (this->super_Link).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__00149620;
  pBVar1 = (this->super_Link).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1,(long)(this->super_Link).neighbors_.
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar1);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

static bool registerT()
            {
                const auto name = typeid(T).name();
                Factory::data()[name] = [](Args... args) -> Base*
                {
                    return new T(std::forward<Args>(args)...);
                };
                return true;
            }